

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperationMultiQueueTests.cpp
# Opt level: O1

void vkt::synchronization::anon_unknown_2::createBarrierMultiQueue
               (DeviceInterface *vk,VkCommandBuffer *cmdBuffer,SyncInfo *writeSync,
               SyncInfo *readSync,Resource *resource,deUint32 writeFamily,deUint32 readFamily,
               VkSharingMode sharingMode,bool secondQueue)

{
  ResourceType type;
  bool bVar1;
  VkImageMemoryBarrier barrier;
  
  type = resource->m_type;
  if (type != RESOURCE_TYPE_BUFFER) {
    if (type == RESOURCE_TYPE_IMAGE) {
      makeImageMemoryBarrier
                (&barrier,writeSync->accessMask,readSync->accessMask,writeSync->imageLayout,
                 readSync->imageLayout,(VkImage)(resource->m_imageData).handle.m_internal,
                 (resource->m_imageData).subresourceRange);
      if (sharingMode == VK_SHARING_MODE_EXCLUSIVE && writeFamily != readFamily) {
        barrier.dstQueueFamilyIndex = readFamily;
        barrier.srcQueueFamilyIndex = writeFamily;
        if (secondQueue) {
          barrier.oldLayout = barrier.newLayout;
          barrier.srcAccessMask = barrier.dstAccessMask;
        }
      }
      else if (secondQueue) {
        return;
      }
      (*vk->_vptr_DeviceInterface[0x6d])
                (vk,*cmdBuffer,(ulong)writeSync->stageMask,(ulong)readSync->stageMask,0,0,0,0,0,1,
                 (int)&barrier);
      return;
    }
    bVar1 = isIndirectBuffer(type);
    if (!bVar1) {
      return;
    }
  }
  if (sharingMode == VK_SHARING_MODE_EXCLUSIVE && writeFamily != readFamily) {
    barrier.sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
    barrier.pNext = (void *)0x0;
    barrier.srcAccessMask = writeSync->accessMask;
    barrier.dstAccessMask = readSync->accessMask;
    barrier.newLayout = readFamily;
    barrier._32_8_ = (resource->m_bufferData).handle.m_internal;
    barrier.image.m_internal = (resource->m_bufferData).offset;
    barrier.subresourceRange._0_8_ = (resource->m_bufferData).size;
    barrier.oldLayout = writeFamily;
    (*vk->_vptr_DeviceInterface[0x6d])
              (vk,*cmdBuffer,(ulong)writeSync->stageMask,(ulong)readSync->stageMask,0,0,0,1,&barrier
               ,0,0);
  }
  return;
}

Assistant:

void createBarrierMultiQueue (const DeviceInterface&	vk,
							  const VkCommandBuffer&	cmdBuffer,
							  const SyncInfo&			writeSync,
							  const SyncInfo&			readSync,
							  const Resource&			resource,
							  const deUint32			writeFamily,
							  const deUint32			readFamily,
							  const VkSharingMode		sharingMode,
							  const bool				secondQueue = false)
{
	if (resource.getType() == RESOURCE_TYPE_IMAGE)
	{
		VkImageMemoryBarrier barrier = makeImageMemoryBarrier(writeSync.accessMask, readSync.accessMask,
			writeSync.imageLayout, readSync.imageLayout, resource.getImage().handle, resource.getImage().subresourceRange);

		if (writeFamily != readFamily && VK_SHARING_MODE_EXCLUSIVE == sharingMode)
		{
			barrier.srcQueueFamilyIndex = writeFamily;
			barrier.dstQueueFamilyIndex = readFamily;
			if (secondQueue)
			{
				barrier.oldLayout		= barrier.newLayout;
				barrier.srcAccessMask	= barrier.dstAccessMask;
			}
			vk.cmdPipelineBarrier(cmdBuffer, writeSync.stageMask, readSync.stageMask, (VkDependencyFlags)0, 0u, (const VkMemoryBarrier*)DE_NULL, 0u, (const VkBufferMemoryBarrier*)DE_NULL, 1u, &barrier);
		}
		else if (!secondQueue)
			vk.cmdPipelineBarrier(cmdBuffer, writeSync.stageMask, readSync.stageMask, (VkDependencyFlags)0, 0u, (const VkMemoryBarrier*)DE_NULL, 0u, (const VkBufferMemoryBarrier*)DE_NULL, 1u, &barrier);
	}
	else if ((resource.getType() == RESOURCE_TYPE_BUFFER || isIndirectBuffer(resource.getType()))	&&
			 writeFamily != readFamily																&&
			 VK_SHARING_MODE_EXCLUSIVE == sharingMode)
	{
		const VkBufferMemoryBarrier barrier =
		{
			VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType	sType;
			DE_NULL,									// const void*		pNext;
			writeSync.accessMask ,						// VkAccessFlags	srcAccessMask;
			readSync.accessMask,						// VkAccessFlags	dstAccessMask;
			writeFamily,								// deUint32			srcQueueFamilyIndex;
			readFamily,									// deUint32			destQueueFamilyIndex;
			resource.getBuffer().handle,				// VkBuffer			buffer;
			resource.getBuffer().offset,				// VkDeviceSize		offset;
			resource.getBuffer().size,					// VkDeviceSize		size;
		};
		vk.cmdPipelineBarrier(cmdBuffer, writeSync.stageMask, readSync.stageMask, (VkDependencyFlags)0, 0u, (const VkMemoryBarrier*)DE_NULL, 1u, (const VkBufferMemoryBarrier*)&barrier, 0u, (const VkImageMemoryBarrier *)DE_NULL);
	}
}